

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManUpdateStats(Nf_Man_t *p)

{
  uint uVar1;
  Jf_Par_t *pJVar2;
  Gia_Man_t *p_00;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Nf_Mat_t *pNVar6;
  int *pCutSet;
  uint *puVar7;
  int iVar8;
  
  pJVar2 = p->pPars;
  pJVar2->MapAreaF = 0.0;
  p->nInvs = 0;
  pJVar2->Area = 0;
  pJVar2->Edge = 0;
  iVar8 = p->pGia->nObjs;
  while (1 < iVar8) {
    iVar8 = iVar8 + -1;
    pGVar5 = Gia_ManObj(p->pGia,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar3 = Gia_ObjIsBuf(pGVar5);
      if (iVar3 == 0) {
        for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
          iVar4 = Nf_ObjMapRefNum(p,iVar8,iVar3);
          if (iVar4 != 0) {
            pNVar6 = Nf_ObjMatchBest(p,iVar8,iVar3);
            if ((pNVar6->field_0x3 & 0x40) == 0) {
              pCutSet = Nf_ObjCutSet(p,iVar8);
              puVar7 = (uint *)Nf_CutFromHandle(pCutSet,*(uint *)pNVar6 >> 0x14 & 0x3ff);
              uVar1 = *puVar7;
              if ((uVar1 & 0x1f) !=
                  *(uint *)&p->pCells[*(uint *)pNVar6 & 0xfffff].field_0x10 >> 0x1c) {
                __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x865,"void Nf_ManUpdateStats(Nf_Man_t *)");
              }
              pJVar2 = p->pPars;
              pJVar2->MapAreaF = p->pCells[*(uint *)pNVar6 & 0xfffff].AreaF + pJVar2->MapAreaF;
              pJVar2->Area = pJVar2->Area + 1;
              pJVar2->Edge = (ulong)(uVar1 & 0x1f) + pJVar2->Edge;
            }
            else {
              pJVar2 = p->pPars;
              pJVar2->MapAreaF = p->InvAreaF + pJVar2->MapAreaF;
              pJVar2->Area = pJVar2->Area + 1;
              pJVar2->Edge = pJVar2->Edge + 1;
              p->nInvs = p->nInvs + 1;
            }
          }
        }
      }
      else {
        iVar3 = Nf_ObjMapRefNum(p,iVar8,1);
        if (iVar3 != 0) {
          pJVar2 = p->pPars;
          pJVar2->MapAreaF = p->InvAreaF + pJVar2->MapAreaF;
          pJVar2->Area = pJVar2->Area + 1;
          pJVar2->Edge = pJVar2->Edge + 1;
          p->nInvs = p->nInvs + 1;
        }
      }
    }
  }
  iVar8 = 0;
  while( true ) {
    p_00 = p->pGia;
    if (p_00->vCis->nSize <= iVar8) {
      return;
    }
    pGVar5 = Gia_ManCi(p_00,iVar8);
    iVar3 = Gia_ObjId(p_00,pGVar5);
    if (iVar3 == 0) break;
    iVar3 = Nf_ObjMapRefNum(p,iVar3,1);
    if (iVar3 != 0) {
      pJVar2 = p->pPars;
      pJVar2->MapAreaF = p->InvAreaF + pJVar2->MapAreaF;
      pJVar2->Area = pJVar2->Area + 1;
      pJVar2->Edge = pJVar2->Edge + 1;
      p->nInvs = p->nInvs + 1;
    }
    iVar8 = iVar8 + 1;
  }
  return;
}

Assistant:

void Nf_ManUpdateStats( Nf_Man_t * p )
{
    Nf_Mat_t * pM;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    int i, c, Id, * pCut;
    p->pPars->MapAreaF = 0; p->nInvs = 0;
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
            }
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            if ( pM->fCompl )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
                continue;
            }
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            pCell = Nf_ManCell( p, pM->Gate );
            assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
            p->pPars->MapAreaF += pCell->AreaF;
            p->pPars->Edge += Nf_CutSize(pCut);
            p->pPars->Area++;
            //printf( "%5d (%d) : Gate = %7s \n", i, c, pCell->pName );
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            p->pPars->MapAreaF += p->InvAreaF;
            p->pPars->Edge++;
            p->pPars->Area++;
            p->nInvs++;
        }
}